

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_2d1;
  Callback local_2d0;
  allocator local_2a9;
  string local_2a8;
  anon_class_1_0_00000001 local_281;
  Callback local_280;
  allocator local_259;
  string local_258;
  anon_class_1_0_00000001 local_231;
  NullCallback local_230;
  anon_class_1_0_00000001 local_209;
  NullCallback local_208;
  anon_class_1_0_00000001 local_1e1;
  NullCallback local_1e0;
  anon_class_1_0_00000001 local_1b9;
  Callback local_1b8;
  anon_class_1_0_00000001 local_191;
  Callback local_190;
  anon_class_1_0_00000001 local_169;
  NullCallback local_168;
  anon_class_1_0_00000001 local_141;
  NullCallback local_140;
  anon_class_1_0_00000001 local_119;
  Callback local_118;
  anon_class_1_0_00000001 local_f1;
  Callback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__1,void>
            ((function<void(char_const*)> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",&local_f0);
  std::function<void_(const_char_*)>::~function(&local_f0);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",&local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  std::function<void()>::function<ParseOptions(int,char**)::__3,void>
            ((function<void()> *)&local_140,&local_141);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'t',"trace","Trace execution",&local_140);
  std::function<void_()>::~function(&local_140);
  std::function<void()>::function<ParseOptions(int,char**)::__4,void>
            ((function<void()> *)&local_168,&local_169);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"wasi",
             "Assume input module is WASI compliant (Export  WASI API the the module and invoke _start function)"
             ,&local_168);
  std::function<void_()>::~function(&local_168);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__5,void>
            ((function<void(char_const*)> *)&local_190,&local_191);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'e',"env","ENV",
             "Pass the given environment string in the WASI runtime",&local_190);
  std::function<void_(const_char_*)>::~function(&local_190);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__6,void>
            ((function<void(char_const*)> *)&local_1b8,&local_1b9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'d',"dir","DIR",
             "Pass the given directory the the WASI runtime",&local_1b8);
  std::function<void_(const_char_*)>::~function(&local_1b8);
  std::function<void()>::function<ParseOptions(int,char**)::__7,void>
            ((function<void()> *)&local_1e0,&local_1e1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",&local_1e0);
  std::function<void_()>::~function(&local_1e0);
  std::function<void()>::function<ParseOptions(int,char**)::__8,void>
            ((function<void()> *)&local_208,&local_209);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",&local_208
            );
  std::function<void_()>::~function(&local_208);
  std::function<void()>::function<ParseOptions(int,char**)::__9,void>
            ((function<void()> *)&local_230,&local_231);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,&local_230);
  std::function<void_()>::~function(&local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"filename",&local_259);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__10,void>
            ((function<void(char_const*)> *)&local_280,&local_281);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_258,One,&local_280);
  std::function<void_(const_char_*)>::~function(&local_280);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"arg",&local_2a9);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__11,void>
            ((function<void(char_const*)> *)&local_2d0,&local_2d1);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_2a8,ZeroOrMore,&local_2d0);
  std::function<void_(const_char_*)>::~function(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wasm-interp", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStderr();
  });
  s_features.AddOptions(&parser);
  parser.AddOption('V', "value-stack-size", "SIZE",
                   "Size in elements of the value stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.value_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('C', "call-stack-size", "SIZE",
                   "Size in elements of the call stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.call_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('t', "trace", "Trace execution",
                   []() { s_trace_stream = s_stdout_stream.get(); });
  parser.AddOption("wasi",
                   "Assume input module is WASI compliant (Export "
                   " WASI API the the module and invoke _start function)",
                   []() { s_wasi = true; });
  parser.AddOption(
      'e', "env", "ENV",
      "Pass the given environment string in the WASI runtime",
      [](const std::string& argument) { s_wasi_env.push_back(argument); });
  parser.AddOption(
      'd', "dir", "DIR", "Pass the given directory the the WASI runtime",
      [](const std::string& argument) { s_wasi_dirs.push_back(argument); });
  parser.AddOption(
      "run-all-exports",
      "Run all the exported functions, in order. Useful for testing",
      []() { s_run_all_exports = true; });
  parser.AddOption("host-print",
                   "Include an importable function named \"host.print\" for "
                   "printing to stdout",
                   []() { s_host_print = true; });
  parser.AddOption(
      "dummy-import-func",
      "Provide a dummy implementation of all imported functions. The function "
      "will log the call and return an appropriate zero value.",
      []() { s_dummy_import_func = true; });

  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) { s_infile = argument; });
  parser.AddArgument(
      "arg", OptionParser::ArgumentCount::ZeroOrMore,
      [](const char* argument) { s_wasi_argv.push_back(argument); });
  parser.Parse(argc, argv);
}